

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sparse_basic.c
# Opt level: O2

void test_sparse_basic(void)

{
  wchar_t wVar1;
  int iVar2;
  int iVar3;
  archive_entry *entry;
  char *__ptr;
  archive *paVar4;
  sparse *sparse;
  sparse *sparse_00;
  long offset;
  sparse sparse_file3 [3];
  sparse sparse_file [3];
  undefined4 local_428 [2];
  undefined4 local_420;
  
  sparse_file3[1].type = DATA;
  sparse_file3[1]._4_4_ = 0;
  sparse_file3[2].size = 0;
  sparse_file3[0].type = HOLE;
  sparse_file3[0]._4_4_ = 0;
  sparse_file3[0].size = 0x400;
  sparse_file3[1].size = 0x2800;
  sparse_file3[2].type = END;
  sparse_file3[2]._4_4_ = 0;
  entry = archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_sparse_basic.c"
                   ,L'ŉ',(uint)(entry != (archive_entry *)0x0),"(ae = archive_entry_new()) != NULL"
                   ,(void *)0x0);
  archive_entry_set_size(entry,0x2800);
  for (offset = 0; (int)offset != 0x2800; offset = offset + 0x400) {
    archive_entry_sparse_add_entry(entry,offset,0x400);
  }
  failure("There should be no sparse");
  wVar1 = archive_entry_sparse_count(entry);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_sparse_basic.c"
                      ,L'Ŗ',0,"0",(long)wVar1,"archive_entry_sparse_count(ae)",(void *)0x0);
  archive_entry_free(entry);
  __ptr = getcwd((char *)0x0,0x1000);
  wVar1 = assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_sparse_basic.c"
                           ,L'Ɲ',(uint)(__ptr != (char *)0x0),"cwd != NULL",(void *)0x0);
  if (wVar1 != L'\0') {
    sparse_file[1].type = DATA;
    sparse_file[1]._4_4_ = 0;
    sparse_file[2].size = 0;
    sparse_file[0].type = HOLE;
    sparse_file[0]._4_4_ = 0;
    sparse_file[0].size = 0x400;
    sparse_file[1].size = 0x2800;
    sparse_file[2].type = END;
    sparse_file[2]._4_4_ = 0;
    memset(local_428,0,0x3f0);
    create_sparse_file("can_sparse",sparse_file);
    iVar2 = open("can_sparse",2);
    if (-1 < iVar2) {
      local_428[0] = 1;
      local_420 = 0x11;
      iVar3 = ioctl(iVar2,0xc020660b);
      close(iVar2);
      unlink("can_sparse");
      if (-1 < iVar3) {
        paVar4 = archive_read_disk_new();
        assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_sparse_basic.c"
                         ,L'ƪ',(uint)(paVar4 != (archive *)0x0),
                         "(a = archive_read_disk_new()) != NULL",(void *)0x0);
        verify_sparse_file(paVar4,"file0",(sparse *)&DAT_00249d50,5);
        verify_sparse_file(paVar4,"file1",(sparse *)&DAT_00249df0,2);
        verify_sparse_file(paVar4,"file2",(sparse *)&DAT_00249e50,0x14);
        verify_sparse_file(paVar4,"file3",sparse_file3,0);
        iVar2 = archive_read_free(paVar4);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_sparse_basic.c"
                            ,L'Ʊ',0,"ARCHIVE_OK",(long)iVar2,"archive_read_free(a)",(void *)0x0);
        paVar4 = archive_read_disk_new();
        iVar2 = 0x2335bd;
        iVar3 = 0;
        assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_sparse_basic.c"
                         ,L'ƶ',(uint)(paVar4 != (archive *)0x0),
                         "(a = archive_read_disk_new()) != NULL",(void *)0x0);
        verify_sparse_file2(paVar4,(char *)0x0,sparse,iVar2,iVar3);
        verify_sparse_file2(paVar4,(char *)0x1,sparse_00,iVar2,iVar3);
        iVar2 = archive_read_free(paVar4);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_sparse_basic.c"
                            ,L'ƻ',0,"ARCHIVE_OK",(long)iVar2,"archive_read_free(a)",(void *)0x0);
        free(__ptr);
        return;
      }
    }
    free(__ptr);
    skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_sparse_basic.c"
                   ,L'ơ');
    test_skipping(
                 "This filesystem or platform do not support the reporting of the holes of a sparse file through API such as lseek(HOLE)"
                 );
  }
  return;
}

Assistant:

DEFINE_TEST(test_sparse_basic)
{
	char *cwd;
	struct archive *a;
	/*
	 * The alignment of the hole of sparse files deeply depends
	 * on filesystem. In my experience, sparse_file2 test with
	 * 204800 bytes hole size did not pass on ZFS and the result
	 * of that test seemed the size was too small, thus you should
	 * keep a hole size more than 409600 bytes to pass this test
	 * on all platform.
	 */
	const struct sparse sparse_file0[] = {
		{ DATA,	 1024 }, { HOLE,   2048000 },
		{ DATA,	 2048 }, { HOLE,   2048000 },
		{ DATA,	 4096 }, { HOLE,  20480000 },
		{ DATA,	 8192 }, { HOLE, 204800000 },
		{ DATA,     1 }, { END,	0 }
	};
	const struct sparse sparse_file1[] = {
		{ HOLE,	409600 }, { DATA, 1 },
		{ HOLE,	409600 }, { DATA, 1 },
		{ HOLE,	409600 }, { END,  0 }
	};
	const struct sparse sparse_file2[] = {
		{ HOLE,	409600 * 1 }, { DATA, 1024 },
		{ HOLE,	409600 * 2 }, { DATA, 1024 },
		{ HOLE,	409600 * 3 }, { DATA, 1024 },
		{ HOLE,	409600 * 4 }, { DATA, 1024 },
		{ HOLE,	409600 * 5 }, { DATA, 1024 },
		{ HOLE,	409600 * 6 }, { DATA, 1024 },
		{ HOLE,	409600 * 7 }, { DATA, 1024 },
		{ HOLE,	409600 * 8 }, { DATA, 1024 },
		{ HOLE,	409600 * 9 }, { DATA, 1024 },
		{ HOLE,	409600 * 10}, { DATA, 1024 },/* 10 */
		{ HOLE,	409600 * 1 }, { DATA, 1024 * 1 },
		{ HOLE,	409600 * 2 }, { DATA, 1024 * 2 },
		{ HOLE,	409600 * 3 }, { DATA, 1024 * 3 },
		{ HOLE,	409600 * 4 }, { DATA, 1024 * 4 },
		{ HOLE,	409600 * 5 }, { DATA, 1024 * 5 },
		{ HOLE,	409600 * 6 }, { DATA, 1024 * 6 },
		{ HOLE,	409600 * 7 }, { DATA, 1024 * 7 },
		{ HOLE,	409600 * 8 }, { DATA, 1024 * 8 },
		{ HOLE,	409600 * 9 }, { DATA, 1024 * 9 },
		{ HOLE,	409600 * 10}, { DATA, 1024 * 10},/* 20 */
		{ END,	0 }
	};
	const struct sparse sparse_file3[] = {
 		/* This hole size is too small to create a sparse
		 * files for almost filesystem. */
		{ HOLE,	 1024 }, { DATA, 10240 },
		{ END,	0 }
	};

	/*
	 * Test for the case that sparse data indicates just the whole file
	 * data.
	 */
	test_sparse_whole_file_data();

	/* Check if the filesystem where CWD on can
	 * report the number of the holes of a sparse file. */
#ifdef PATH_MAX
	cwd = getcwd(NULL, PATH_MAX);/* Solaris getcwd needs the size. */
#else
	cwd = getcwd(NULL, 0);
#endif
	if (!assert(cwd != NULL))
		return;
	if (!is_sparse_supported(cwd)) {
		free(cwd);
		skipping("This filesystem or platform do not support "
		    "the reporting of the holes of a sparse file through "
		    "API such as lseek(HOLE)");
		return;
	}

	/*
	 * Get sparse data through directory traversals.
	 */
	assert((a = archive_read_disk_new()) != NULL);

	verify_sparse_file(a, "file0", sparse_file0, 5);
	verify_sparse_file(a, "file1", sparse_file1, 2);
	verify_sparse_file(a, "file2", sparse_file2, 20);
	verify_sparse_file(a, "file3", sparse_file3, 0);

	assertEqualInt(ARCHIVE_OK, archive_read_free(a));

	/*
	 * Get sparse data through archive_read_disk_entry_from_file().
	 */
	assert((a = archive_read_disk_new()) != NULL);

	verify_sparse_file2(a, "file0", sparse_file0, 5, 0);
	verify_sparse_file2(a, "file0", sparse_file0, 5, 1);

	assertEqualInt(ARCHIVE_OK, archive_read_free(a));
	free(cwd);
}